

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extract.hpp
# Opt level: O0

extraction_result_t * __thiscall
bredis::extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::operator()
          (extraction_result_t *__return_storage_ptr__,
          extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this,
          int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value)

{
  buffers_iterator<boost::asio::const_buffer,_char> __last;
  size_t in_stack_fffffffffffffe68;
  long local_160;
  void *local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_88;
  void *pvStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  difference_type local_48;
  difference_type size;
  string str;
  int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value_local;
  extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this_local;
  
  str.field_2._8_8_ = value;
  std::__cxx11::string::string((string *)&size);
  local_58 = *(undefined8 *)(str.field_2._8_8_ + 0x30);
  local_88 = *(undefined8 *)str.field_2._8_8_;
  pvStack_80 = (((buffers_iterator<boost::asio::const_buffer,_char> *)(str.field_2._8_8_ + 8))->
               current_buffer_).data_;
  local_78 = *(undefined8 *)(str.field_2._8_8_ + 0x10);
  uStack_70 = *(undefined8 *)(str.field_2._8_8_ + 0x18);
  local_68 = *(undefined8 *)(str.field_2._8_8_ + 0x20);
  uStack_60 = *(undefined8 *)(str.field_2._8_8_ + 0x28);
  local_98 = *(undefined8 *)(str.field_2._8_8_ + 0x68);
  local_c8 = *(undefined8 *)(str.field_2._8_8_ + 0x38);
  uStack_c0 = *(undefined8 *)*(undefined1 (*) [48])(str.field_2._8_8_ + 0x40);
  local_b8 = *(undefined8 *)(str.field_2._8_8_ + 0x48);
  uStack_b0 = *(undefined8 *)(str.field_2._8_8_ + 0x50);
  local_a8 = *(undefined8 *)(str.field_2._8_8_ + 0x58);
  uStack_a0 = *(undefined8 *)(str.field_2._8_8_ + 0x60);
  __last.position_ = in_stack_fffffffffffffe68;
  __last._0_48_ = *(undefined1 (*) [48])(str.field_2._8_8_ + 0x40);
  local_48 = std::distance<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
                       (*(buffers_iterator<boost::asio::const_buffer,_char> *)
                         (str.field_2._8_8_ + 8),__last);
  std::__cxx11::string::reserve((ulong)&size);
  local_e8 = *(undefined8 *)(str.field_2._8_8_ + 0x30);
  local_118 = *(undefined8 *)str.field_2._8_8_;
  uStack_110 = *(undefined8 *)(str.field_2._8_8_ + 8);
  local_108 = *(undefined8 *)(str.field_2._8_8_ + 0x10);
  uStack_100 = *(undefined8 *)(str.field_2._8_8_ + 0x18);
  local_f8 = *(undefined8 *)(str.field_2._8_8_ + 0x20);
  uStack_f0 = *(undefined8 *)(str.field_2._8_8_ + 0x28);
  local_128 = *(undefined8 *)(str.field_2._8_8_ + 0x68);
  local_158 = (((buffers_iterator<boost::asio::const_buffer,_char> *)(str.field_2._8_8_ + 0x38))->
              current_buffer_).data_;
  uStack_150 = *(undefined8 *)(str.field_2._8_8_ + 0x40);
  local_148 = *(undefined8 *)(str.field_2._8_8_ + 0x48);
  uStack_140 = *(undefined8 *)(str.field_2._8_8_ + 0x50);
  local_138 = *(undefined8 *)(str.field_2._8_8_ + 0x58);
  uStack_130 = *(undefined8 *)(str.field_2._8_8_ + 0x60);
  std::__cxx11::string::append<boost::asio::buffers_iterator<boost::asio::const_buffer,char>,void>
            ((string *)&size,*(buffers_iterator<boost::asio::const_buffer,_char> *)str.field_2._8_8_
             ,*(buffers_iterator<boost::asio::const_buffer,_char> *)(str.field_2._8_8_ + 0x38));
  local_160 = boost::lexical_cast<long,std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size)
  ;
  boost::
  variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>
  ::variant<long>(__return_storage_ptr__,&local_160,true);
  std::__cxx11::string::~string((string *)&size);
  return __return_storage_ptr__;
}

Assistant:

extracts::extraction_result_t
    operator()(const markers::int_t<Iterator> &value) const {
        std::string str;
        auto size = std::distance(value.string.from, value.string.to);
        str.reserve(size);
        str.append(value.string.from, value.string.to);
        return extracts::int_t{boost::lexical_cast<extracts::int_t>(str)};
    }